

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O0

void __thiscall Varnode::saveXml(Varnode *this,ostream *s)

{
  ostream *poVar1;
  bool bVar2;
  int2 iVar3;
  uint4 uVar4;
  AddrSpace *pAVar5;
  uintb uVar6;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  ostream *local_18;
  ostream *s_local;
  Varnode *this_local;
  
  local_18 = s;
  s_local = (ostream *)this;
  std::operator<<(s,"<addr");
  pAVar5 = Address::getSpace(&this->loc);
  poVar1 = local_18;
  uVar6 = Address::getOffset(&this->loc);
  (*pAVar5->_vptr_AddrSpace[8])(pAVar5,poVar1,uVar6,(ulong)(uint)this->size);
  poVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"ref",&local_39);
  uVar4 = getCreateIndex(this);
  a_v_u(poVar1,(string *)local_38,(ulong)uVar4);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  poVar1 = local_18;
  if (this->mergegroup != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"grp",&local_71);
    iVar3 = getMergeGroup(this);
    a_v_i(poVar1,(string *)local_70,(long)iVar3);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  bVar2 = isPersist(this);
  if (bVar2) {
    std::operator<<(local_18," persists=\"true\"");
  }
  bVar2 = isAddrTied(this);
  if (bVar2) {
    std::operator<<(local_18," addrtied=\"true\"");
  }
  bVar2 = isUnaffected(this);
  if (bVar2) {
    std::operator<<(local_18," unaff=\"true\"");
  }
  bVar2 = isInput(this);
  if (bVar2) {
    std::operator<<(local_18," input=\"true\"");
  }
  std::operator<<(local_18,"/>");
  return;
}

Assistant:

void Varnode::saveXml(ostream &s) const

{
  s << "<addr";
  loc.getSpace()->saveXmlAttributes(s,loc.getOffset(),size);
  a_v_u(s,"ref",getCreateIndex());
  if (mergegroup != 0)
    a_v_i(s,"grp",getMergeGroup());
  if (isPersist())
    s << " persists=\"true\"";
  if (isAddrTied())
    s << " addrtied=\"true\"";
  if (isUnaffected())
    s << " unaff=\"true\"";
  if (isInput())
    s << " input=\"true\"";
  s << "/>";
}